

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

TPZFMatrix<long> * __thiscall
TPZFMatrix<long>::operator-=(TPZFMatrix<long> *this,TPZMatrix<long> *aBase)

{
  long *plVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar2 = __dynamic_cast(aBase,&TPZMatrix<long>::typeinfo,&typeinfo,0);
  if (lVar2 == 0) {
    Error("TPZFMatrix<TVar> &TPZFMatrix<long>::operator-=(const TPZMatrix<TVar> &) [TVar = long]",
          " incompatible argument");
  }
  lVar4 = *(long *)(lVar2 + 8);
  if ((lVar4 != (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow) ||
     (lVar3 = *(long *)(lVar2 + 0x10),
     lVar3 != (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol)) {
    Error("Operator-= <matrixs with different dimensions>",(char *)0x0);
    lVar4 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fRow;
    lVar3 = (this->super_TPZMatrix<long>).super_TPZBaseMatrix.fCol;
  }
  if (0 < lVar3 * lVar4) {
    lVar2 = *(long *)(lVar2 + 0x20);
    plVar1 = this->fElem;
    lVar5 = 0;
    do {
      plVar1[lVar5] = plVar1[lVar5] - *(long *)(lVar2 + lVar5 * 8);
      lVar5 = lVar5 + 1;
    } while (lVar3 * lVar4 - lVar5 != 0);
  }
  return this;
}

Assistant:

TPZFMatrix<TVar> &TPZFMatrix<TVar>::operator-=(const TPZMatrix<TVar> &aBase ) {
    auto A = dynamic_cast<const TPZFMatrix<TVar>*>(&aBase);
    if(!A){
        Error(__PRETTY_FUNCTION__," incompatible argument");
    }
    if ( (A->Rows() != this->Rows())  ||  (A->Cols() != this->Cols()) )
        Error( "Operator-= <matrixs with different dimensions>" );
    
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    TVar * pm = fElem;
    TVar * pa = A->fElem;
    
    for ( int64_t i = 0; i < size; i++ ) *pm++ -= *pa++;
    
    return( *this );
}